

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O2

double f_noncentral_variance(double a,int m,int n)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  if (4 < n) {
    dVar2 = (double)m;
    dVar3 = (double)n;
    dVar1 = a + dVar2;
    dVar4 = dVar3 + -2.0;
    return ((dVar1 + dVar1) * dVar3 * dVar3 + dVar1 * dVar1) /
           ((dVar3 + -4.0) * dVar4 * dVar2 * dVar2) -
           (dVar1 * dVar1 * dVar3 * dVar3) / (dVar4 * dVar4 * dVar2 * dVar2);
  }
  std::operator<<((ostream *)&std::cerr," \n");
  std::operator<<((ostream *)&std::cerr,"F_NONCENTRAL_VARIANCE - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  The variance is not defined for N < 5.\n");
  exit(1);
}

Assistant:

double f_noncentral_variance ( double a, int m, int n )

//****************************************************************************80
//
//  Purpose:
//
//    F_NONCENTRAL_VARIANCE returns the variance of the F noncentral PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    18 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, a parameter of the PDF.
//
//    Input, int M, N, parameters of the PDF.
//    1 <= M,
//    1 <= N.
//    Note, however, that the variance is not defined unless 5 <= N.
//
//    Output, double F_NONCENTRAL_VARIANCE, the variance of the PDF.
//
{
  double mr;
  double nr;
  double variance;

  if ( n < 5 )
  {
    cerr << " \n";
    cerr << "F_NONCENTRAL_VARIANCE - Fatal error!\n";
    cerr << "  The variance is not defined for N < 5.\n";
    exit ( 1 );
  }

  mr = static_cast<double>(m );
  nr = static_cast<double>(n );

  variance = ( ( mr + a ) * ( mr + a ) + 2.0 * ( mr + a ) * nr * nr )
    / ( ( nr - 2.0 ) * ( nr - 4.0 ) * mr * mr )
    - ( mr + a ) * ( mr + a ) * nr * nr
    / ( ( nr - 2.0 ) * ( nr - 2.0 ) * mr * mr );

  return variance;
}